

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# responseproxy.cpp
# Opt level: O3

kTRContinueMode int_trp_assert_error_v2(int line,char *file,char *exp)

{
  kTRContinueMode kVar1;
  undefined8 local_30;
  undefined8 local_28;
  
  trun::TestRunner::GetCurrentTestModule();
  kVar1 = trun::TestResponseProxy::AssertError((TestResponseProxy *)(local_30 + 0xa0),exp,file,line)
  ;
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  return kVar1;
}

Assistant:

static kTRContinueMode int_trp_assert_error_v2(int line, const char *file, const char *exp) {
    // Just swizzle the arguments back to the old interface..
    return TestRunner::GetCurrentTestModule()->GetTestResponseProxy().AssertError(exp, file, line);
}